

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O2

int gost_grasshopper_cipher_ctl(EVP_CIPHER_CTX *ctx,int type,int arg,void *ptr)

{
  undefined4 uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  EVP_MD_CTX *out;
  char *pcVar5;
  undefined8 uVar6;
  gost_grasshopper_cipher_ctx *c;
  uchar *puVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  EVP_MD_CTX *in;
  uchar seq [8];
  uchar adjusted_iv [16];
  uchar newkey [32];
  
  if (type == 0x2a) {
    uVar6 = EVP_CIPHER_CTX_get0_cipher(ctx);
    iVar2 = EVP_CIPHER_get_mode(uVar6);
    if (iVar2 != 5) {
      return -1;
    }
    c = (gost_grasshopper_cipher_ctx *)EVP_CIPHER_CTX_get_cipher_data(ctx);
    seq = *ptr;
    iVar2 = decrement_sequence(seq,arg);
    if (iVar2 == 0) {
      iVar9 = 0x68;
      iVar2 = 0x477;
LAB_0011b33d:
      ERR_GOST_error(0x6f,iVar9,
                     "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_grasshopper_cipher.c"
                     ,iVar2);
      return -1;
    }
    iVar2 = gost_tlstree(0x3f7,(uchar *)&c->master_key,newkey,seq);
    if (iVar2 < 1) goto LAB_0011b2cf;
    adjusted_iv[0] = '\0';
    adjusted_iv[1] = '\0';
    adjusted_iv[2] = '\0';
    adjusted_iv[3] = '\0';
    adjusted_iv[4] = '\0';
    adjusted_iv[5] = '\0';
    adjusted_iv[6] = '\0';
    adjusted_iv[7] = '\0';
    adjusted_iv[8] = '\0';
    adjusted_iv[9] = '\0';
    adjusted_iv[10] = '\0';
    adjusted_iv[0xb] = '\0';
    adjusted_iv[0xc] = '\0';
    adjusted_iv[0xd] = '\0';
    adjusted_iv[0xe] = '\0';
    adjusted_iv[0xf] = '\0';
    puVar7 = (uchar *)EVP_CIPHER_CTX_original_iv(ctx);
    adjusted_iv._0_8_ = *(undefined8 *)puVar7;
    uVar8 = 0;
    for (uVar3 = 7; -1 < (int)uVar3; uVar3 = uVar3 - 1) {
      uVar10 = (uint)seq[uVar3] + uVar8 + adjusted_iv[uVar3];
      uVar8 = (uint)(0xff < uVar10);
      adjusted_iv[uVar3] = (uchar)uVar10;
    }
    EVP_CIPHER_CTX_set_num(ctx,0);
    puVar7 = (uchar *)EVP_CIPHER_CTX_iv_noconst(ctx);
    *(undefined8 *)puVar7 = adjusted_iv._0_8_;
    *(undefined8 *)(puVar7 + 8) = adjusted_iv._8_8_;
    gost_grasshopper_cipher_key(c,newkey);
LAB_0011b303:
    iVar2 = 1;
  }
  else {
    if (type == 8) {
      lVar4 = EVP_CIPHER_CTX_get_cipher_data(ptr);
      pcVar5 = (char *)EVP_CIPHER_CTX_get_cipher_data(ctx);
      if (*pcVar5 != '\x06') {
        return -1;
      }
      in = *(EVP_MD_CTX **)(pcVar5 + 0x1c8);
      out = *(EVP_MD_CTX **)(lVar4 + 0x1c8);
      if (in == out) {
        out = (EVP_MD_CTX *)EVP_MD_CTX_new();
        *(EVP_MD_CTX **)(lVar4 + 0x1c8) = out;
        if (out == (EVP_MD_CTX *)0x0) {
          iVar9 = 0xc0100;
          iVar2 = 0x4bc;
          goto LAB_0011b33d;
        }
        in = *(EVP_MD_CTX **)(pcVar5 + 0x1c8);
      }
      iVar2 = EVP_MD_CTX_copy(out,in);
      return iVar2;
    }
    if (type == 0x20) {
      pcVar5 = (char *)EVP_CIPHER_CTX_get_cipher_data(ctx);
      if (*pcVar5 == '\x05') {
        if (arg != 0) {
LAB_0011b2c9:
          if ((arg & 0xfU) == 0) {
            *(int *)(pcVar5 + 0x1a8) = arg;
            goto LAB_0011b303;
          }
        }
      }
      else if (arg != 0 && *pcVar5 == '\x06') goto LAB_0011b2c9;
    }
    else if (type == 0x28) {
      pcVar5 = (char *)EVP_CIPHER_CTX_get_cipher_data(ctx);
      if (*pcVar5 == '\x06') {
        iVar2 = gost2015_process_unprotected_attributes
                          ((stack_st_X509_ATTRIBUTE *)ptr,arg,0x10,(uchar *)(pcVar5 + 0x1b4));
        return iVar2;
      }
    }
    else {
      if (type == 6) {
        uVar1 = EVP_CIPHER_CTX_get_key_length(ctx);
        iVar2 = RAND_priv_bytes(ptr,uVar1);
        if (0 < iVar2) goto LAB_0011b303;
        iVar9 = 0x7e;
        iVar2 = 1099;
      }
      else {
        iVar9 = 0x82;
        iVar2 = 0x4c4;
      }
      ERR_GOST_error(0x6f,iVar9,
                     "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_grasshopper_cipher.c"
                     ,iVar2);
    }
LAB_0011b2cf:
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

static int gost_grasshopper_cipher_ctl(EVP_CIPHER_CTX *ctx, int type, int arg, void *ptr)
{
    switch (type) {
    case EVP_CTRL_RAND_KEY:{
            if (RAND_priv_bytes
                ((unsigned char *)ptr, EVP_CIPHER_CTX_key_length(ctx)) <= 0) {
                GOSTerr(GOST_F_GOST_GRASSHOPPER_CIPHER_CTL, GOST_R_RNG_ERROR);
                return -1;
            }
            break;
        }
    case EVP_CTRL_KEY_MESH:{
            gost_grasshopper_cipher_ctx_ctr *c =
                EVP_CIPHER_CTX_get_cipher_data(ctx);
            if ((c->c.type != GRASSHOPPER_CIPHER_CTRACPKM &&
                c->c.type != GRASSHOPPER_CIPHER_CTRACPKMOMAC)
                || (arg == 0)
               || (arg % GRASSHOPPER_BLOCK_SIZE))
                return -1;
            c->section_size = arg;
            break;
        }
    case EVP_CTRL_TLSTREE:
        {
          unsigned char newkey[32];
          int mode = EVP_CIPHER_CTX_mode(ctx);
          gost_grasshopper_cipher_ctx_ctr *ctr_ctx = NULL;
          gost_grasshopper_cipher_ctx *c = NULL;

          unsigned char adjusted_iv[16];
          unsigned char seq[8];
          int j, carry, decrement_arg;
          if (mode != EVP_CIPH_CTR_MODE)
              return -1;

          ctr_ctx = (gost_grasshopper_cipher_ctx_ctr *)
              EVP_CIPHER_CTX_get_cipher_data(ctx);
          c = &(ctr_ctx->c);

          /*
           * 'arg' parameter indicates what we should do with sequence value.
           * 
           * When function called, seq is incremented after MAC calculation.
           * In ETM mode, we use seq 'as is' in the ctrl-function (arg = 0)
           * Otherwise we have to decrease it in the implementation (arg = 1).
           */
          memcpy(seq, ptr, 8);
          decrement_arg = arg;
          if (!decrement_sequence(seq, decrement_arg))
          {
              GOSTerr(GOST_F_GOST_GRASSHOPPER_CIPHER_CTL, GOST_R_CTRL_CALL_FAILED);
              return -1;
          }

          if (gost_tlstree(NID_grasshopper_cbc, c->master_key.k.b, newkey,
                (const unsigned char *)seq) > 0) {
            memset(adjusted_iv, 0, 16);
            memcpy(adjusted_iv, EVP_CIPHER_CTX_original_iv(ctx), 8);
            for(j=7,carry=0; j>=0; j--)
            {
              int adj_byte = adjusted_iv[j]+seq[j]+carry;
              carry = (adj_byte > 255) ? 1 : 0;
              adjusted_iv[j] = adj_byte & 0xFF;
            }
            EVP_CIPHER_CTX_set_num(ctx, 0);
            memcpy(EVP_CIPHER_CTX_iv_noconst(ctx), adjusted_iv, 16);

            gost_grasshopper_cipher_key(c, newkey);
            return 1;
          }
        }
        return -1;
#if 0
    case EVP_CTRL_AEAD_GET_TAG:
    case EVP_CTRL_AEAD_SET_TAG:
        {
            int taglen = arg;
            unsigned char *tag = ptr;

            gost_grasshopper_cipher_ctx *c = EVP_CIPHER_CTX_get_cipher_data(ctx);
            if (c->c.type != GRASSHOPPER_CIPHER_MGM)
                return -1;

            if (taglen > KUZNYECHIK_MAC_MAX_SIZE) {
                CRYPTOCOMerr(CRYPTOCOM_F_GOST_GRASSHOPPER_CIPHER_CTL,
                        CRYPTOCOM_R_INVALID_TAG_LENGTH);
                return -1;
            }

            if (type == EVP_CTRL_AEAD_GET_TAG)
                memcpy(tag, c->final_tag, taglen);
            else
                memcpy(c->final_tag, tag, taglen);

            return 1;
        }
#endif
    case EVP_CTRL_PROCESS_UNPROTECTED:
    {
      STACK_OF(X509_ATTRIBUTE) *x = ptr;
      gost_grasshopper_cipher_ctx_ctr *c = EVP_CIPHER_CTX_get_cipher_data(ctx);

      if (c->c.type != GRASSHOPPER_CIPHER_CTRACPKMOMAC)
        return -1;

      return gost2015_process_unprotected_attributes(x, arg, KUZNYECHIK_MAC_MAX_SIZE, c->tag);
    }
    case EVP_CTRL_COPY: {
        EVP_CIPHER_CTX *out = ptr;

        gost_grasshopper_cipher_ctx_ctr *out_cctx = EVP_CIPHER_CTX_get_cipher_data(out);
        gost_grasshopper_cipher_ctx_ctr *in_cctx  = EVP_CIPHER_CTX_get_cipher_data(ctx);

        if (in_cctx->c.type != GRASSHOPPER_CIPHER_CTRACPKMOMAC)
            return -1;

        if (in_cctx->omac_ctx == out_cctx->omac_ctx) {
            out_cctx->omac_ctx = EVP_MD_CTX_new();
            if (out_cctx->omac_ctx == NULL) {
                GOSTerr(GOST_F_GOST_GRASSHOPPER_CIPHER_CTL, ERR_R_MALLOC_FAILURE);
                return -1;
            }
        }
        return EVP_MD_CTX_copy(out_cctx->omac_ctx, in_cctx->omac_ctx);
    }
    default:
        GOSTerr(GOST_F_GOST_GRASSHOPPER_CIPHER_CTL,
                GOST_R_UNSUPPORTED_CIPHER_CTL_COMMAND);
        return -1;
    }
    return 1;
}